

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::writeHintStream(QPDFWriter *this,int hint_id)

{
  element_type *peVar1;
  uint uVar2;
  int objid;
  char cVar3;
  uint uVar4;
  _Alloc_hider hint_buffer_00;
  string *psVar5;
  byte compressed;
  char cVar6;
  uint uVar7;
  uint uVar8;
  string *__val;
  bool bVar9;
  int O;
  string __str;
  int S;
  string hint_buffer;
  uint local_7c;
  PipelinePopper local_78;
  QPDFWriter local_68;
  int local_58;
  uint local_54;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  compressed = false;
  local_54 = 0;
  local_7c = 0;
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->compress_streams == true) {
    compressed = peVar1->qdf_mode ^ 1;
  }
  hint_buffer_00._M_p = (pointer)&local_50;
  QPDF::generateHintStream
            (peVar1->pdf,&peVar1->new_obj,&peVar1->obj,(string *)hint_buffer_00._M_p,
             (int *)&local_54,(int *)&local_7c,(bool)compressed);
  openObject(this,hint_id);
  setDataKey(this,hint_id);
  __val = (string *)local_50._M_string_length;
  local_58 = hint_id;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27b7af,(void *)0x3,(size_t)hint_buffer_00._M_p);
  if ((bool)compressed != false) {
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27dcd1,(void *)0x15,(size_t)hint_buffer_00._M_p);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dce7,(void *)0x3,(size_t)hint_buffer_00._M_p);
  uVar2 = -local_54;
  if (0 < (int)local_54) {
    uVar2 = local_54;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    hint_buffer_00._M_p = (pointer)(ulong)uVar2;
    uVar7 = 4;
    do {
      uVar8 = uVar7;
      uVar4 = (uint)hint_buffer_00._M_p;
      if (uVar4 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001f4c51;
      }
      if (uVar4 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001f4c51;
      }
      if (uVar4 < 10000) goto LAB_001f4c51;
      hint_buffer_00._M_p = (pointer)(hint_buffer_00._M_p / 10000);
      uVar7 = uVar8 + 4;
    } while (99999 < uVar4);
    uVar8 = uVar8 + 1;
  }
LAB_001f4c51:
  uVar7 = local_54 >> 0x1f;
  local_78.qw = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar8 - (char)((int)local_54 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&((local_78.qw)->m).
                             super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + (ulong)uVar7),uVar8,uVar2);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_78.qw,(void *)local_78.stack_id,(size_t)hint_buffer_00._M_p);
  if (local_78.qw != &local_68) {
    operator_delete(local_78.qw,
                    (ulong)((long)&(local_68.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  if (local_7c != 0) {
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27de6f,(void *)0x4,(size_t)hint_buffer_00._M_p);
    uVar2 = -local_7c;
    if (0 < (int)local_7c) {
      uVar2 = local_7c;
    }
    uVar8 = 1;
    if (9 < uVar2) {
      hint_buffer_00._M_p = (pointer)(ulong)uVar2;
      uVar7 = 4;
      do {
        uVar8 = uVar7;
        uVar4 = (uint)hint_buffer_00._M_p;
        if (uVar4 < 100) {
          uVar8 = uVar8 - 2;
          goto LAB_001f4d3b;
        }
        if (uVar4 < 1000) {
          uVar8 = uVar8 - 1;
          goto LAB_001f4d3b;
        }
        if (uVar4 < 10000) goto LAB_001f4d3b;
        hint_buffer_00._M_p = (pointer)(hint_buffer_00._M_p / 10000);
        uVar7 = uVar8 + 4;
      } while (99999 < uVar4);
      uVar8 = uVar8 + 1;
    }
LAB_001f4d3b:
    uVar7 = local_7c >> 0x1f;
    local_78.qw = &local_68;
    std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar8 - (char)((int)local_7c >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&((local_78.qw)->m).
                               super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + (ulong)uVar7),uVar8,uVar2);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_78.qw,(void *)local_78.stack_id,(size_t)hint_buffer_00._M_p);
    if (local_78.qw != &local_68) {
      operator_delete(local_78.qw,
                      (ulong)((long)&(local_68.m.
                                      super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->pdf + 1));
    }
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27d570,(void *)0x9,(size_t)hint_buffer_00._M_p);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar1->encrypted == true) && ((peVar1->cur_data_key)._M_string_length != 0)) &&
     (peVar1->encrypt_use_aes == true)) {
    __val = (string *)(((ulong)__val & 0xfffffffffffffff0) + 0x20);
  }
  cVar6 = '\x01';
  if ((string *)0x9 < __val) {
    hint_buffer_00._M_p = (pointer)__val;
    cVar3 = '\x04';
    do {
      cVar6 = cVar3;
      if (hint_buffer_00._M_p < (string *)0x64) {
        cVar6 = cVar6 + -2;
        goto LAB_001f4e2d;
      }
      if (hint_buffer_00._M_p < (string *)0x3e8) {
        cVar6 = cVar6 + -1;
        goto LAB_001f4e2d;
      }
      if (hint_buffer_00._M_p < (string *)0x2710) goto LAB_001f4e2d;
      psVar5 = (string *)((ulong)hint_buffer_00._M_p / 10000);
      bVar9 = (string *)0x1869f < hint_buffer_00._M_p;
      hint_buffer_00._M_p = (pointer)psVar5;
      cVar3 = cVar6 + '\x04';
    } while (bVar9);
    cVar6 = cVar6 + '\x01';
  }
LAB_001f4e2d:
  local_78.qw = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_78.qw,(uint)local_78.stack_id,(unsigned_long)__val);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_78.qw,(void *)local_78.stack_id,(size_t)hint_buffer_00._M_p);
  if (local_78.qw != &local_68) {
    operator_delete(local_78.qw,
                    (ulong)((long)&(local_68.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dceb,(void *)0xb,(size_t)hint_buffer_00._M_p);
  objid = local_58;
  if ((string *)local_50._M_string_length == (string *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = (local_50._M_dataplus._M_p + -1)[local_50._M_string_length] == '\n';
    hint_buffer_00._M_p = local_50._M_dataplus._M_p;
  }
  local_78.stack_id = 0;
  local_78.qw = this;
  pushEncryptionFilter(this,&local_78);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_50._M_dataplus._M_p,(void *)local_50._M_string_length,
             (size_t)hint_buffer_00._M_p);
  PipelinePopper::~PipelinePopper(&local_78);
  if (!bVar9) {
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27dccf,(void *)0x1,(size_t)hint_buffer_00._M_p);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dd87,(void *)0x9,(size_t)hint_buffer_00._M_p);
  closeObject(this,objid);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writeHintStream(int hint_id)
{
    std::string hint_buffer;
    int S = 0;
    int O = 0;
    bool compressed = (m->compress_streams && !m->qdf_mode);
    QPDF::Writer::generateHintStream(m->pdf, m->new_obj, m->obj, hint_buffer, S, O, compressed);

    openObject(hint_id);
    setDataKey(hint_id);

    size_t hlen = hint_buffer.size();

    writeString("<< ");
    if (compressed) {
        writeString("/Filter /FlateDecode ");
    }
    writeString("/S ");
    writeString(std::to_string(S));
    if (O) {
        writeString(" /O ");
        writeString(std::to_string(O));
    }
    writeString(" /Length ");
    adjustAESStreamLength(hlen);
    writeString(std::to_string(hlen));
    writeString(" >>\nstream\n");

    if (m->encrypted) {
        QTC::TC("qpdf", "QPDFWriter encrypted hint stream");
    }
    char last_char = hint_buffer.empty() ? '\0' : hint_buffer.back();
    {
        PipelinePopper pp_enc(this);
        pushEncryptionFilter(pp_enc);
        writeString(hint_buffer);
    }

    if (last_char != '\n') {
        writeString("\n");
    }
    writeString("endstream");
    closeObject(hint_id);
}